

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t archive_read_format_cab_bid(archive_read *a,wchar_t best_bid)

{
  wchar_t wVar1;
  ssize_t in_RAX;
  long *plVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  char *p;
  long lVar6;
  bool bVar7;
  ssize_t bytes_avail;
  
  wVar1 = L'\xffffffff';
  if ((((best_bid < L'A') &&
       (bytes_avail = in_RAX, plVar2 = (long *)__archive_read_ahead(a,8,(ssize_t *)0x0),
       plVar2 != (long *)0x0)) && (wVar1 = L'@', *plVar2 != 0x4643534d)) &&
     ((wVar1 = L'\0', (char)*plVar2 == 'M' && (*(char *)((long)plVar2 + 1) == 'Z')))) {
    lVar6 = 0;
    uVar5 = 0x1000;
    do {
      while( true ) {
        wVar1 = L'\0';
        if (0x1ffff < lVar6) {
          return L'\0';
        }
        pvVar3 = __archive_read_ahead(a,lVar6 + uVar5,&bytes_avail);
        if (pvVar3 == (void *)0x0) break;
        p = (char *)(lVar6 + (long)pvVar3);
        pcVar4 = (char *)(bytes_avail + (long)pvVar3);
        while (p + 8 < pcVar4) {
          wVar1 = find_cab_magic(p);
          p = p + (uint)wVar1;
          if (wVar1 == L'\0') {
            return L'@';
          }
        }
        lVar6 = (long)p - (long)pvVar3;
      }
      bVar7 = 0xff < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar7);
  }
  return wVar1;
}

Assistant:

static int
archive_read_format_cab_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	ssize_t bytes_avail, offset, window;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 64)
		return (-1);

	if ((p = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);

	if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
		return (64);

	/*
	 * Attempt to handle self-extracting archives
	 * by noting a PE header and searching forward
	 * up to 128k for a 'MSCF' marker.
	 */
	if (p[0] == 'M' && p[1] == 'Z') {
		offset = 0;
		window = 4096;
		while (offset < (1024 * 128)) {
			const char *h = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (h == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 128)
					return (0);
				continue;
			}
			p = h + offset;
			while (p + 8 < h + bytes_avail) {
				int next;
				if ((next = find_cab_magic(p)) == 0)
					return (64);
				p += next;
			}
			offset = p - h;
		}
	}
	return (0);
}